

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlGetBooleanProp(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,char *name,int def)

{
  int iVar1;
  xmlChar *str1;
  xmlAttrPtr ownerItem;
  xmlSchemaTypePtr node_00;
  xmlChar *unaff_RBX;
  xmlChar *unaff_R12;
  
  str1 = xmlSchemaGetProp(ctxt,node,name);
  if (str1 != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(str1,(xmlChar *)"true");
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = xmlStrEqual(str1,(xmlChar *)"false");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,"1");
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = xmlStrEqual(str1,"0");
      if (iVar1 != 0) {
        return 0;
      }
      ownerItem = xmlSchemaGetPropNode(node,name);
      node_00 = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
      xmlSchemaPSimpleTypeErr
                (ctxt,XML_SCHEMAP_INVALID_BOOLEAN,(xmlSchemaBasicItemPtr)ownerItem,
                 (xmlNodePtr)node_00,(xmlSchemaTypePtr)0x0,(char *)str1,(xmlChar *)0x0,(char *)0x0,
                 unaff_RBX,unaff_R12);
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
xmlGetBooleanProp(xmlSchemaParserCtxtPtr ctxt,
		  xmlNodePtr node,
                  const char *name, int def)
{
    const xmlChar *val;

    val = xmlSchemaGetProp(ctxt, node, name);
    if (val == NULL)
        return (def);
    /*
    * 3.2.2.1 Lexical representation
    * An instance of a datatype that is defined as `boolean`
    * can have the following legal literals {true, false, 1, 0}.
    */
    if (xmlStrEqual(val, BAD_CAST "true"))
        def = 1;
    else if (xmlStrEqual(val, BAD_CAST "false"))
        def = 0;
    else if (xmlStrEqual(val, BAD_CAST "1"))
	def = 1;
    else if (xmlStrEqual(val, BAD_CAST "0"))
        def = 0;
    else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_INVALID_BOOLEAN,
	    NULL,
	    (xmlNodePtr) xmlSchemaGetPropNode(node, name),
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN),
	    NULL, val, NULL, NULL, NULL);
    }
    return (def);
}